

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall
cmOrderDirectories::AddRuntimeLibrary(cmOrderDirectories *this,string *fullPath,char *soname)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  string *__k;
  iterator iVar5;
  cmOrderDirectoriesConstraintSOName *pcVar6;
  bool bVar7;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string dir;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  cmOrderDirectoriesConstraintSOName *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  cmGlobalGenerator *local_50;
  _Alloc_hider local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pVar8 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->EmmittedConstraintSOName,fullPath);
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((this->ImplicitDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      cmsys::SystemTools::GetFilenamePath(&local_90,fullPath);
      lVar4 = std::__cxx11::string::rfind((char *)fullPath,0x5224a2,0xffffffffffffffff);
      if (lVar4 != -1) {
        if ((AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::splitFramework == '\0') &&
           (iVar3 = __cxa_guard_acquire(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)
                                         ::splitFramework), iVar3 != 0)) {
          AddRuntimeLibrary::splitFramework.regmatch.startp[0] = (char *)0x0;
          AddRuntimeLibrary::splitFramework.regmatch.endp[0] = (char *)0x0;
          AddRuntimeLibrary::splitFramework.regmatch.searchstring = (char *)0x0;
          AddRuntimeLibrary::splitFramework.program = (char *)0x0;
          cmsys::RegularExpression::compile
                    (&AddRuntimeLibrary::splitFramework,"^(.*)/(.*).framework/(.*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &AddRuntimeLibrary::splitFramework,&__dso_handle);
          __cxa_guard_release(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::
                               splitFramework);
        }
        bVar2 = cmsys::RegularExpression::find
                          (&AddRuntimeLibrary::splitFramework,(fullPath->_M_dataplus)._M_p,
                           &AddRuntimeLibrary::splitFramework.regmatch);
        if (bVar2) {
          if (AddRuntimeLibrary::splitFramework.regmatch.startp[3] == (char *)0x0) {
            local_b0 = &local_a0;
            local_a8 = 0;
            local_a0 = 0;
          }
          else {
            local_b0 = &local_a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,AddRuntimeLibrary::splitFramework.regmatch.startp[3],
                       AddRuntimeLibrary::splitFramework.regmatch.endp[3]);
          }
          if (AddRuntimeLibrary::splitFramework.regmatch.startp[2] == (char *)0x0) {
            local_50 = (cmGlobalGenerator *)&stack0xffffffffffffffc0;
            local_48._M_p = (pointer)0x0;
            local_40 = 0;
          }
          else {
            local_50 = (cmGlobalGenerator *)&stack0xffffffffffffffc0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,AddRuntimeLibrary::splitFramework.regmatch.startp[2],
                       AddRuntimeLibrary::splitFramework.regmatch.endp[2]);
          }
          lVar4 = std::__cxx11::string::find((char *)&local_b0,(ulong)local_50,0);
          bVar7 = lVar4 != -1;
        }
        else {
          bVar7 = false;
        }
        if (bVar2) {
          if (local_50 != (cmGlobalGenerator *)&stack0xffffffffffffffc0) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
          }
        }
        if (bVar7) {
          if (AddRuntimeLibrary::splitFramework.regmatch.startp[1] == (char *)0x0) {
            local_70 = (cmOrderDirectoriesConstraintSOName *)local_60;
            local_68 = 0;
            local_60[0] = 0;
          }
          else {
            local_70 = (cmOrderDirectoriesConstraintSOName *)local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,AddRuntimeLibrary::splitFramework.regmatch.startp[1],
                       AddRuntimeLibrary::splitFramework.regmatch.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
          if (local_70 != (cmOrderDirectoriesConstraintSOName *)local_60) {
            operator_delete(local_70,CONCAT71(local_60._1_7_,local_60[0]) + 1);
          }
        }
      }
      __k = GetRealPath(this,&local_90);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->ImplicitDirectories)._M_t,__k);
      p_Var1 = &(this->ImplicitDirectories)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        pcVar6 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
        cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
                  (pcVar6,this,fullPath,soname);
        local_70 = pcVar6;
        std::vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>::
        emplace_back<cmOrderDirectoriesConstraint*>
                  ((vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>
                    *)&this->ImplicitDirEntries,(cmOrderDirectoriesConstraint **)&local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        return;
      }
    }
    pcVar6 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
    cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
              (pcVar6,this,fullPath,soname);
    local_90._M_dataplus._M_p = (pointer)pcVar6;
    std::vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>::
    emplace_back<cmOrderDirectoriesConstraint*>
              ((vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>
                *)&this->ConstraintEntries,(cmOrderDirectoriesConstraint **)&local_90);
  }
  return;
}

Assistant:

void cmOrderDirectories::AddRuntimeLibrary(std::string const& fullPath,
                                           const char* soname)
{
  // Add the runtime library at most once.
  if (this->EmmittedConstraintSOName.insert(fullPath).second) {
    // Implicit link directories need special handling.
    if (!this->ImplicitDirectories.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);

      if (fullPath.rfind(".framework") != std::string::npos) {
        static cmsys::RegularExpression splitFramework(
          "^(.*)/(.*).framework/(.*)$");
        if (splitFramework.find(fullPath) &&
            (std::string::npos !=
             splitFramework.match(3).find(splitFramework.match(2)))) {
          dir = splitFramework.match(1);
        }
      }

      if (this->IsImplicitDirectory(dir)) {
        this->ImplicitDirEntries.push_back(
          new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
        return;
      }
    }

    // Construct the runtime information entry for this library.
    this->ConstraintEntries.push_back(
      new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
  } else {
    // This can happen if the same library is linked multiple times.
    // In that case the runtime information check need be done only
    // once anyway.  For shared libs we could add a check in AddItem
    // to not repeat them.
  }
}